

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

int32_t __thiscall icu_63::RegexMatcher::end(RegexMatcher *this,UErrorCode *err)

{
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  if (this->fMatch != '\0') {
    if (-1 < this->fPattern->fGroupMap->count) {
      return (int32_t)this->fMatchEnd;
    }
    *err = U_INDEX_OUTOFBOUNDS_ERROR;
    return -1;
  }
  *err = U_REGEX_INVALID_STATE;
  return -1;
}

Assistant:

int32_t RegexMatcher::end(UErrorCode &err) const {
    return end(0, err);
}